

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

block_state deflate_huff(deflate_state *s,int flush)

{
  byte bVar1;
  uint uVar2;
  Bytef *local_58;
  Bytef *local_48;
  Bytef *local_38;
  uch cc;
  int bflush;
  int flush_local;
  deflate_state *s_local;
  
  while ((s->lookahead != 0 || (fill_window(s), s->lookahead != 0))) {
    s->match_length = 0;
    bVar1 = s->window[s->strstart];
    uVar2 = s->sym_next;
    s->sym_next = uVar2 + 1;
    s->sym_buf[uVar2] = '\0';
    uVar2 = s->sym_next;
    s->sym_next = uVar2 + 1;
    s->sym_buf[uVar2] = '\0';
    uVar2 = s->sym_next;
    s->sym_next = uVar2 + 1;
    s->sym_buf[uVar2] = bVar1;
    s->dyn_ltree[bVar1].fc.freq = s->dyn_ltree[bVar1].fc.freq + 1;
    s->lookahead = s->lookahead - 1;
    s->strstart = s->strstart + 1;
    if (s->sym_next == s->sym_end) {
      if (s->block_start < 0) {
        local_38 = (Bytef *)0x0;
      }
      else {
        local_38 = s->window + (s->block_start & 0xffffffff);
      }
      cm_zlib__tr_flush_block(s,(charf *)local_38,(ulong)s->strstart - s->block_start,0);
      s->block_start = (ulong)s->strstart;
      flush_pending(s->strm);
      if (s->strm->avail_out == 0) {
        return need_more;
      }
    }
  }
  if (flush == 0) {
    return need_more;
  }
  s->insert = 0;
  if (flush != 4) {
    if (s->sym_next != 0) {
      if (s->block_start < 0) {
        local_58 = (Bytef *)0x0;
      }
      else {
        local_58 = s->window + (s->block_start & 0xffffffff);
      }
      cm_zlib__tr_flush_block(s,(charf *)local_58,(ulong)s->strstart - s->block_start,0);
      s->block_start = (ulong)s->strstart;
      flush_pending(s->strm);
      if (s->strm->avail_out == 0) {
        return need_more;
      }
    }
    return block_done;
  }
  if (s->block_start < 0) {
    local_48 = (Bytef *)0x0;
  }
  else {
    local_48 = s->window + (s->block_start & 0xffffffff);
  }
  cm_zlib__tr_flush_block(s,(charf *)local_48,(ulong)s->strstart - s->block_start,1);
  s->block_start = (ulong)s->strstart;
  flush_pending(s->strm);
  if (s->strm->avail_out == 0) {
    return finish_started;
  }
  return finish_done;
}

Assistant:

local block_state deflate_huff(s, flush)
    deflate_state *s;
    int flush;
{
    int bflush;             /* set if current block must be flushed */

    for (;;) {
        /* Make sure that we have a literal to write. */
        if (s->lookahead == 0) {
            fill_window(s);
            if (s->lookahead == 0) {
                if (flush == Z_NO_FLUSH)
                    return need_more;
                break;      /* flush the current block */
            }
        }

        /* Output a literal byte */
        s->match_length = 0;
        Tracevv((stderr,"%c", s->window[s->strstart]));
        _tr_tally_lit (s, s->window[s->strstart], bflush);
        s->lookahead--;
        s->strstart++;
        if (bflush) FLUSH_BLOCK(s, 0);
    }
    s->insert = 0;
    if (flush == Z_FINISH) {
        FLUSH_BLOCK(s, 1);
        return finish_done;
    }
    if (s->sym_next)
        FLUSH_BLOCK(s, 0);
    return block_done;
}